

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall
QPDF::CopiedStreamDataProvider::CopiedStreamDataProvider
          (CopiedStreamDataProvider *this,QPDF *destination_qpdf)

{
  _Rb_tree_header *p_Var1;
  
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,true);
  (this->super_StreamDataProvider)._vptr_StreamDataProvider =
       (_func_int **)&PTR__CopiedStreamDataProvider_002ac8d8;
  this->destination_qpdf = destination_qpdf;
  p_Var1 = &(this->foreign_streams)._M_t._M_impl.super__Rb_tree_header;
  (this->foreign_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->foreign_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->foreign_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->foreign_streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->foreign_streams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->foreign_stream_data)._M_t._M_impl.super__Rb_tree_header;
  (this->foreign_stream_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->foreign_stream_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->foreign_stream_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->foreign_stream_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->foreign_stream_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

QPDF::CopiedStreamDataProvider::CopiedStreamDataProvider(QPDF& destination_qpdf) :
    QPDFObjectHandle::StreamDataProvider(true),
    destination_qpdf(destination_qpdf)
{
}